

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O0

double formula_eval(rpf_t *rpf)

{
  void *pvVar1;
  double *pdVar2;
  double tmp;
  operation_t *op;
  double *pdStack_2018;
  int sp;
  double *stack [512];
  double _stack [512];
  rpf_t *local_10;
  rpf_t *rpf_local;
  
  op._4_4_ = 0;
  for (local_10 = rpf; local_10 != (rpf_t *)0x0; local_10 = local_10->next) {
    if ((local_10->type & ~TYPE_VARIABLE) == TYPE_VALUE) {
      stack[(long)op._4_4_ + -1] = (double *)local_10->value;
    }
    else {
      pvVar1 = local_10->value;
      pdVar2 = (double *)
               (**(code **)((long)pvVar1 + 0x10))
                         (stack + (long)(op._4_4_ - *(int *)((long)pvVar1 + 0x18)) + -1);
      op._4_4_ = op._4_4_ - *(int *)((long)pvVar1 + 0x18);
      stack[(long)op._4_4_ + -1] = (double *)(stack + (long)op._4_4_ + 0x1ff);
      stack[(long)op._4_4_ + 0x1ff] = pdVar2;
    }
    op._4_4_ = op._4_4_ + 1;
  }
  return *pdStack_2018;
}

Assistant:

double formula_eval(struct rpf_t *rpf)
{
  double _stack[512];
  double *stack[512];
  int sp;
  struct operation_t *op;
  double tmp;

  sp = 0;
  for (; rpf; rpf = rpf->next)
  {
    switch (rpf->type)
    {
      case TYPE_VALUE:
      case TYPE_VARIABLE:
        stack[sp] = ((double *)rpf->value);
        sp++;
        break;
      default:
        op = (struct operation_t *)rpf->value;
        tmp = (op->func)(&stack[sp - op->narg]);
        sp -= op->narg;
        stack[sp] = &_stack[sp];
        _stack[sp] = tmp;
        sp++;
        break;
    }
  }
  return *stack[0];
}